

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSetPageSize(Btree *p,int pageSize,int nReserve,int iFix)

{
  int *piVar1;
  int iVar2;
  BtShared *pBVar3;
  int iVar4;
  u8 *p_00;
  
  pBVar3 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if ((pBVar3->btsFlags & 2) == 0) {
    if (nReserve < 0) {
      nReserve = pBVar3->pageSize - pBVar3->usableSize;
    }
    if ((pageSize - 0x200U < 0xfe01) && ((pageSize + 0x1ffffU & pageSize) == 0)) {
      pBVar3->pageSize = pageSize;
      if (pBVar3->pTmpSpace != (u8 *)0x0) {
        p_00 = pBVar3->pTmpSpace + -4;
        pBVar3->pTmpSpace = p_00;
        pcache1Free(p_00);
        pBVar3->pTmpSpace = (u8 *)0x0;
      }
    }
    iVar4 = sqlite3PagerSetPagesize(pBVar3->pPager,&pBVar3->pageSize,nReserve);
    pBVar3->usableSize = pBVar3->pageSize - (nReserve & 0xffffU);
    if (iFix != 0) {
      *(byte *)&pBVar3->btsFlags = (byte)pBVar3->btsFlags | 2;
    }
    if (p->sharable == '\0') {
      return iVar4;
    }
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    iVar2 = *piVar1;
  }
  else {
    if (p->sharable == '\0') {
      return 8;
    }
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    iVar2 = *piVar1;
    iVar4 = 8;
  }
  if (iVar2 == 0) {
    unlockBtreeMutex(p);
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPageSize(Btree *p, int pageSize, int nReserve, int iFix){
  int rc = SQLITE_OK;
  BtShared *pBt = p->pBt;
  assert( nReserve>=-1 && nReserve<=255 );
  sqlite3BtreeEnter(p);
#if SQLITE_HAS_CODEC
  if( nReserve>pBt->optimalReserve ) pBt->optimalReserve = (u8)nReserve;
#endif
  if( pBt->btsFlags & BTS_PAGESIZE_FIXED ){
    sqlite3BtreeLeave(p);
    return SQLITE_READONLY;
  }
  if( nReserve<0 ){
    nReserve = pBt->pageSize - pBt->usableSize;
  }
  assert( nReserve>=0 && nReserve<=255 );
  if( pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE &&
        ((pageSize-1)&pageSize)==0 ){
    assert( (pageSize & 7)==0 );
    assert( !pBt->pCursor );
    pBt->pageSize = (u32)pageSize;
    freeTempSpace(pBt);
  }
  rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
  pBt->usableSize = pBt->pageSize - (u16)nReserve;
  if( iFix ) pBt->btsFlags |= BTS_PAGESIZE_FIXED;
  sqlite3BtreeLeave(p);
  return rc;
}